

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinitionUtil.cpp
# Opt level: O0

bool deqp::gles31::Functional::shaderContainsIOBlocks(Shader *shader)

{
  Storage SVar1;
  DefaultBlock *pDVar2;
  size_type sVar3;
  const_reference pvVar4;
  int local_1c;
  Storage storage;
  int ndx;
  Shader *shader_local;
  
  local_1c = 0;
  while( true ) {
    pDVar2 = ProgramInterfaceDefinition::Shader::getDefaultBlock(shader);
    sVar3 = std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::size
                      (&pDVar2->interfaceBlocks);
    if ((int)sVar3 <= local_1c) {
      return false;
    }
    pDVar2 = ProgramInterfaceDefinition::Shader::getDefaultBlock(shader);
    pvVar4 = std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::operator[]
                       (&pDVar2->interfaceBlocks,(long)local_1c);
    SVar1 = pvVar4->storage;
    if ((((SVar1 == STORAGE_IN) || (SVar1 == STORAGE_OUT)) || (SVar1 == STORAGE_PATCH_IN)) ||
       (SVar1 == STORAGE_PATCH_OUT)) break;
    local_1c = local_1c + 1;
  }
  return true;
}

Assistant:

bool shaderContainsIOBlocks (const ProgramInterfaceDefinition::Shader* shader)
{
	for (int ndx = 0; ndx < (int)shader->getDefaultBlock().interfaceBlocks.size(); ++ndx)
	{
		const glu::Storage storage = shader->getDefaultBlock().interfaceBlocks[ndx].storage;
		if (storage == glu::STORAGE_IN			||
			storage == glu::STORAGE_OUT			||
			storage == glu::STORAGE_PATCH_IN	||
			storage == glu::STORAGE_PATCH_OUT)
		{
			return true;
		}
	}
	return false;
}